

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseLengthDelimited
          (UnknownFieldParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  string *s;
  uint size;
  char *pcVar2;
  pair<const_char_*,_int> pVar3;
  
  s = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this->unknown_,num);
  bVar1 = *ptr;
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
    size = pVar3.second;
    pcVar2 = pVar3.first;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    pcVar2 = ptr + 1;
  }
  pcVar2 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar2,size,s);
  return pcVar2;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    std::string* s = unknown_->AddLengthDelimited(num);
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    return ctx->ReadString(ptr, size, s);
  }